

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O0

void __thiscall
TasGrid::GridLocalPolynomial::updateSurpluses<(TasGrid::RuleLocal::erule)2>
          (GridLocalPolynomial *this,MultiIndexSet *work,int max_level,
          vector<int,_std::allocator<int>_> *level,Data2D<int> *dagUp)

{
  allocator<double> *this_00;
  allocator<int> *paVar1;
  int iVar2;
  value_type vVar3;
  int iVar4;
  const_reference pvVar5;
  reference pvVar6;
  size_type sVar7;
  reference pvVar8;
  reference pvVar9;
  int *piVar10;
  double *x_00;
  double dVar11;
  iterator iVar12;
  reference rVar13;
  _Bit_iterator __first;
  _Bit_iterator __last;
  bool local_21d;
  reference local_1a8;
  int local_194;
  double dStack_190;
  int k;
  double basis_value;
  double *branch_surp;
  _Bit_type local_178;
  int local_170;
  int local_16c;
  int branch;
  int current;
  double *surpi;
  _Bit_type *local_158;
  uint local_150;
  _Bit_type *local_148;
  uint local_140;
  _Bit_type *local_138;
  uint local_130;
  _Bit_type *local_128;
  uint local_120;
  int local_114;
  int *piStack_110;
  int j;
  int *pnt;
  int local_100;
  int i_1;
  int s;
  vector<bool,_std::allocator<bool>_> used;
  undefined1 local_c8 [8];
  vector<int,_std::allocator<int>_> monkey_tail;
  undefined1 local_a8 [8];
  vector<int,_std::allocator<int>_> monkey_count;
  undefined1 local_88 [8];
  vector<double,_std::allocator<double>_> x;
  int level_size;
  int l;
  int i;
  allocator<std::vector<int,_std::allocator<int>_>_> local_51;
  undefined1 local_50 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  indexses_for_levels;
  int max_parents;
  int num_points;
  Data2D<int> *dagUp_local;
  vector<int,_std::allocator<int>_> *level_local;
  int max_level_local;
  MultiIndexSet *work_local;
  GridLocalPolynomial *this_local;
  
  indexses_for_levels.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = MultiIndexSet::getNumIndexes(work);
  iVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
  iVar4 = RuleLocal::getMaxNumParents<(TasGrid::RuleLocal::erule)2>();
  indexses_for_levels.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = iVar2 * iVar4;
  ::std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(&local_51);
  ::std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_50,(long)max_level + 1,&local_51);
  ::std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator(&local_51);
  for (level_size = 0;
      level_size <
      indexses_for_levels.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; level_size = level_size + 1) {
    pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)level,(long)level_size);
    if (0 < *pvVar5) {
      pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)level,(long)level_size);
      pvVar6 = ::std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_50,(long)*pvVar5);
      ::std::vector<int,_std::allocator<int>_>::push_back(pvVar6,&level_size);
    }
  }
  for (x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ = 1;
      x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ <= max_level;
      x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ + 1) {
    pvVar6 = ::std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)local_50,
                          (long)x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_);
    sVar7 = ::std::vector<int,_std::allocator<int>_>::size(pvVar6);
    x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = (int)sVar7;
    iVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
    this_00 = (allocator<double> *)
              ((long)&monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7);
    ::std::allocator<double>::allocator(this_00);
    ::std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_88,(long)iVar2,this_00);
    ::std::allocator<double>::~allocator
              ((allocator<double> *)
               ((long)&monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    paVar1 = (allocator<int> *)
             ((long)&monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    ::std::allocator<int>::allocator(paVar1);
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_a8,(long)(max_level + 1),paVar1);
    ::std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    paVar1 = (allocator<int> *)
             ((long)&used.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage + 7);
    ::std::allocator<int>::allocator(paVar1);
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_c8,(long)(max_level + 1),paVar1);
    ::std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&used.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage + 7));
    sVar7 = (size_type)
            indexses_for_levels.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    i_1._3_1_ = 0;
    ::std::allocator<bool>::allocator((allocator<bool> *)((long)&i_1 + 2));
    ::std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&s,sVar7,(bool *)((long)&i_1 + 3),
               (allocator<bool> *)((long)&i_1 + 2));
    ::std::allocator<bool>::~allocator((allocator<bool> *)((long)&i_1 + 2));
    for (local_100 = 0;
        local_100 <
        (int)x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage; local_100 = local_100 + 1) {
      pvVar6 = ::std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_50,
                            (long)x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage._4_4_);
      pvVar8 = ::std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)local_100);
      pnt._4_4_ = *pvVar8;
      piStack_110 = MultiIndexSet::getIndex(work,pnt._4_4_);
      for (local_114 = 0; local_114 < (this->super_BaseCanonicalGrid).num_dimensions;
          local_114 = local_114 + 1) {
        dVar11 = RuleLocal::getNode<(TasGrid::RuleLocal::erule)2>(piStack_110[local_114]);
        pvVar9 = ::std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_88,(long)local_114);
        *pvVar9 = dVar11;
      }
      iVar12 = ::std::vector<bool,_std::allocator<bool>_>::begin
                         ((vector<bool,_std::allocator<bool>_> *)&s);
      local_138 = iVar12.super__Bit_iterator_base._M_p;
      local_130 = iVar12.super__Bit_iterator_base._M_offset;
      local_128 = local_138;
      local_120 = local_130;
      iVar12 = ::std::vector<bool,_std::allocator<bool>_>::end
                         ((vector<bool,_std::allocator<bool>_> *)&s);
      local_158 = iVar12.super__Bit_iterator_base._M_p;
      local_150 = iVar12.super__Bit_iterator_base._M_offset;
      surpi._7_1_ = 0;
      __first.super__Bit_iterator_base._M_offset = local_120;
      __first.super__Bit_iterator_base._M_p = local_128;
      __first.super__Bit_iterator_base._12_4_ = 0;
      __last.super__Bit_iterator_base._12_4_ = 0;
      __last.super__Bit_iterator_base._M_p =
           (_Bit_type *)SUB128(iVar12.super__Bit_iterator_base._0_12_,0);
      __last.super__Bit_iterator_base._M_offset = SUB124(iVar12.super__Bit_iterator_base._0_12_,8);
      local_148 = local_158;
      local_140 = local_150;
      ::std::fill<std::_Bit_iterator,bool>(__first,__last,(bool *)((long)&surpi + 7));
      _branch = Data2D<double>::getStrip(&this->surpluses,pnt._4_4_);
      local_16c = 0;
      pvVar8 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_a8,0);
      vVar3 = pnt._4_4_;
      *pvVar8 = 0;
      pvVar8 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_c8,0);
      *pvVar8 = vVar3;
      while( true ) {
        pvVar8 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_a8,0);
        if ((int)indexses_for_levels.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage <= *pvVar8) break;
        pvVar8 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_a8,(long)local_16c);
        if (*pvVar8 < (int)indexses_for_levels.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          pvVar8 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_c8,(long)local_16c);
          piVar10 = Data2D<int>::getStrip(dagUp,*pvVar8);
          pvVar8 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_a8,(long)local_16c);
          local_170 = piVar10[*pvVar8];
          local_21d = true;
          if (local_170 != -1) {
            rVar13 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)&s,(long)local_170);
            local_178 = rVar13._M_mask;
            branch_surp = (double *)rVar13._M_p;
            local_21d = ::std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&branch_surp)
            ;
          }
          if (local_21d == false) {
            basis_value = (double)Data2D<double>::getStrip(&this->surpluses,local_170);
            piVar10 = MultiIndexSet::getIndex(work,local_170);
            x_00 = ::std::vector<double,_std::allocator<double>_>::data
                             ((vector<double,_std::allocator<double>_> *)local_88);
            dStack_190 = evalBasisRaw<(TasGrid::RuleLocal::erule)2>(this,piVar10,x_00);
            for (local_194 = 0; local_194 < (this->super_BaseCanonicalGrid).num_outputs;
                local_194 = local_194 + 1) {
              _branch[local_194] =
                   -dStack_190 * *(double *)((long)basis_value + (long)local_194 * 8) +
                   _branch[local_194];
            }
            rVar13 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)&s,(long)local_170);
            local_1a8 = rVar13;
            ::std::_Bit_reference::operator=(&local_1a8,true);
            local_16c = local_16c + 1;
            pvVar8 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_a8,(long)local_16c);
            iVar2 = local_170;
            *pvVar8 = 0;
            pvVar8 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_c8,(long)local_16c);
            *pvVar8 = iVar2;
          }
          else {
            pvVar8 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_a8,(long)local_16c);
            *pvVar8 = *pvVar8 + 1;
          }
        }
        else {
          local_16c = local_16c + -1;
          pvVar8 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_a8,(long)local_16c);
          *pvVar8 = *pvVar8 + 1;
        }
      }
    }
    ::std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)&s);
    ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_c8)
    ;
    ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a8)
    ;
    ::std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_88);
  }
  ::std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_50);
  return;
}

Assistant:

void GridLocalPolynomial::updateSurpluses(MultiIndexSet const &work, int max_level, std::vector<int> const &level, Data2D<int> const &dagUp){
    int num_points = work.getNumIndexes();
    int max_parents = num_dimensions * RuleLocal::getMaxNumParents<effrule>();

    std::vector<std::vector<int>> indexses_for_levels((size_t) max_level+1);
    for(int i=0; i<num_points; i++)
        if (level[i] > 0) indexses_for_levels[level[i]].push_back(i);

    for(int l=1; l<=max_level; l++){
        int level_size = (int) indexses_for_levels[l].size();
        #pragma omp parallel
        {
            std::vector<double> x(num_dimensions);

            std::vector<int> monkey_count(max_level + 1);
            std::vector<int> monkey_tail(max_level + 1);
            std::vector<bool> used(num_points, false);

            #pragma omp for schedule(dynamic)
            for(int s=0; s<level_size; s++){
                int i = indexses_for_levels[l][s];

                int const *pnt = work.getIndex(i);
                for(int j=0; j<num_dimensions; j++)
                    x[j] = RuleLocal::getNode<effrule>(pnt[j]);

                std::fill(used.begin(), used.end(), false);

                double *surpi = surpluses.getStrip(i);

                int current = 0;

                monkey_count[0] = 0;
                monkey_tail[0] = i;

                while(monkey_count[0] < max_parents){
                    if (monkey_count[current] < max_parents){
                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                        if ((branch == -1) || (used[branch])){
                            monkey_count[current]++;
                        }else{
                            const double *branch_surp = surpluses.getStrip(branch);
                            double basis_value = evalBasisRaw<effrule>(work.getIndex(branch), x.data());
                            for(int k=0; k<num_outputs; k++)
                                surpi[k] -= basis_value * branch_surp[k];
                            used[branch] = true;

                            monkey_count[++current] = 0;
                            monkey_tail[current] = branch;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            } // for-loop
        } // omp parallel
    } // level loop
}